

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<std::byte>::emplaceRealloc<std::byte>
          (SmallVectorBase<std::byte> *this,pointer pos,byte *args)

{
  ulong uVar1;
  size_t __n;
  pointer __dest;
  ptrdiff_t _Num;
  EVP_PKEY_CTX *ctx;
  ulong n;
  long lVar2;
  
  if (this->len != 0x7fffffffffffffff) {
    n = this->len + 1;
    uVar1 = this->cap;
    if (n < uVar1 * 2) {
      n = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      n = 0x7fffffffffffffff;
    }
    lVar2 = (long)pos - (long)this->data_;
    __dest = (pointer)operator_new(n);
    __dest[lVar2] = *args;
    ctx = (EVP_PKEY_CTX *)this->data_;
    __n = this->len;
    if (ctx + (__n - (long)pos) == (EVP_PKEY_CTX *)0x0) {
      if (__n != 0) {
        memmove(__dest,ctx,__n);
      }
    }
    else {
      if (ctx != (EVP_PKEY_CTX *)pos) {
        memmove(__dest,ctx,(long)pos - (long)ctx);
      }
      memcpy(__dest + lVar2 + 1,pos,(size_t)(ctx + (__n - (long)pos)));
      ctx = (EVP_PKEY_CTX *)pos;
    }
    cleanup(this,ctx);
    this->len = this->len + 1;
    this->cap = n;
    this->data_ = __dest;
    return __dest + lVar2;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}